

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonParse * jsonParseFuncArg(sqlite3_context *ctx,sqlite3_value *pArg,u32 flgs)

{
  long lVar1;
  uint uVar2;
  undefined8 uVar3;
  sqlite3 *db;
  u32 uVar4;
  u32 uVar5;
  int iVar6;
  int iVar7;
  void *__s2;
  AuxData *pAVar8;
  ulong uVar9;
  JsonParse *pParse;
  u8 *puVar10;
  char *pcVar11;
  uint uVar12;
  byte bVar13;
  sqlite3_context *pCtx;
  undefined8 *__dest;
  ulong uVar14;
  uint uVar15;
  JsonParse *pParse_00;
  ulong uVar16;
  void *pvVar17;
  JsonParse *pJVar18;
  long in_FS_OFFSET;
  bool bVar19;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = pArg->flags & 0x3f;
  if ((0xaaaaaaaaaaaaaaaaU >> (ulong)uVar12 & 1) == 0) {
    if ((0x4000000040004U >> (ulong)uVar12 & 1) == 0) {
      pParse_00 = (JsonParse *)0x0;
    }
    else {
      __s2 = sqlite3ValueText(pArg,'\x01');
      if (__s2 != (void *)0x0) {
        iVar7 = sqlite3ValueBytes(pArg,'\x01');
        pvVar17 = (void *)0x0;
        for (pAVar8 = ctx->pVdbe->pAuxData; pAVar8 != (AuxData *)0x0; pAVar8 = pAVar8->pNextAux) {
          if (pAVar8->iAuxArg == -0x68f72) {
            pvVar17 = pAVar8->pAux;
            break;
          }
        }
        if (pvVar17 != (void *)0x0) {
          uVar2 = *(uint *)((long)pvVar17 + 8);
          uVar14 = (ulong)uVar2;
          uVar16 = 0;
          if (0 < (int)uVar2) {
            uVar16 = 0;
            if (*(void **)(*(long *)((long)pvVar17 + 0x10) + 0x10) == __s2) {
              bVar19 = true;
              uVar9 = 0;
            }
            else {
              uVar9 = 0;
              do {
                if (uVar14 - 1 == uVar9) {
                  if (0 < (int)uVar2) goto LAB_001b9f77;
                  uVar16 = 0;
                  goto LAB_001b9fbb;
                }
                lVar1 = uVar9 * 8;
                uVar9 = uVar9 + 1;
              } while (*(void **)(*(long *)((long)pvVar17 + lVar1 + 0x18) + 0x10) != __s2);
              bVar19 = uVar9 < uVar14;
            }
            if (bVar19) {
              uVar16 = uVar9 & 0xffffffff;
            }
            if (!(bool)((int)uVar2 < 1 | bVar19)) {
LAB_001b9f77:
              uVar9 = 0;
              do {
                lVar1 = *(long *)((long)pvVar17 + uVar9 * 8 + 0x10);
                if ((*(int *)(lVar1 + 0x20) == iVar7) &&
                   (iVar6 = bcmp(*(void **)(lVar1 + 0x10),__s2,(long)iVar7), uVar16 = uVar9,
                   iVar6 == 0)) break;
                uVar9 = uVar9 + 1;
                uVar16 = uVar14;
              } while (uVar14 != uVar9);
            }
          }
LAB_001b9fbb:
          uVar15 = (uint)uVar16;
          if ((int)uVar15 < (int)uVar2) {
            if ((int)uVar15 < (int)(uVar2 - 1)) {
              __dest = (undefined8 *)((long)pvVar17 + (uVar16 & 0xffffffff) * 8 + 0x10);
              uVar3 = *__dest;
              memmove(__dest,(void *)((long)pvVar17 + (uVar16 & 0xffffffff) * 8 + 0x18),
                      (long)(int)(~uVar15 + uVar2) << 3);
              iVar7 = *(int *)((long)pvVar17 + 8);
              *(undefined8 *)((long)pvVar17 + (long)iVar7 * 8 + 8) = uVar3;
              uVar15 = iVar7 - 1;
            }
            pParse_00 = *(JsonParse **)((long)pvVar17 + (long)(int)uVar15 * 8 + 0x10);
          }
          else {
            pParse_00 = (JsonParse *)0x0;
          }
          goto LAB_001ba019;
        }
      }
      pParse_00 = (JsonParse *)0x0;
    }
LAB_001ba019:
    if ((pParse_00 != (JsonParse *)0x0) &&
       (pParse_00->nJPRef = pParse_00->nJPRef + 1, pJVar18 = pParse_00, (flgs & 1) == 0))
    goto LAB_001ba33b;
    db = ctx->pOut->db;
    pCtx = (sqlite3_context *)0x0;
    if ((flgs & 2) == 0) {
      pCtx = ctx;
    }
    iVar7 = (flgs & 1) * 2;
    do {
      pParse = (JsonParse *)sqlite3DbMallocZero(db,0x48);
      if (pParse == (JsonParse *)0x0) {
        pParse = (JsonParse *)0x0;
        goto LAB_001ba31e;
      }
      pParse->zJson = (char *)0x0;
      pParse->db = (sqlite3 *)0x0;
      pParse->nJson = 0;
      pParse->nJPRef = 0;
      pParse->iErr = 0;
      pParse->iDepth = 0;
      pParse->nErr = '\0';
      pParse->oom = '\0';
      pParse->bJsonIsRCStr = '\0';
      pParse->hasNonstd = '\0';
      pParse->bReadOnly = '\0';
      pParse->eEdit = '\0';
      pParse->delta = 0;
      pParse->nIns = 0;
      pParse->iLabel = 0;
      pParse->aBlob = (u8 *)0x0;
      pParse->nBlob = 0;
      pParse->nBlobAlloc = 0;
      pParse->aIns = (u8 *)0x0;
      pParse->db = db;
      pParse->nJPRef = 1;
      pJVar18 = pParse;
      if (pParse_00 != (JsonParse *)0x0) {
        uVar12 = pParse_00->nBlob;
        uVar16 = (ulong)uVar12;
        if (db == (sqlite3 *)0x0) {
          puVar10 = (u8 *)sqlite3Malloc(uVar16);
        }
        else {
          puVar10 = (u8 *)sqlite3DbMallocRawNN(db,uVar16);
        }
        pParse->aBlob = puVar10;
        if (puVar10 == (u8 *)0x0) goto LAB_001ba31e;
        memcpy(puVar10,pParse_00->aBlob,uVar16);
        pParse->nBlob = uVar12;
        pParse->nBlobAlloc = uVar12;
        pParse->hasNonstd = pParse_00->hasNonstd;
        jsonParseFree(pParse_00);
        goto LAB_001ba33b;
      }
      if ((0x1000000010001U >> (sbyte)uVar12 & 1) != 0) {
        local_3c = 0;
        puVar10 = (u8 *)sqlite3_value_blob(pArg);
        pParse->aBlob = puVar10;
        uVar4 = sqlite3ValueBytes(pArg,'\x01');
        pParse->nBlob = uVar4;
        if (uVar4 == 0) {
          pParse->aBlob = (u8 *)0x0;
        }
        else if (pParse->aBlob != (byte *)0x0) {
          bVar13 = *pParse->aBlob & 0xf;
          if ((((bVar13 < 0xd) && (uVar5 = jsonbPayloadSize(pParse,0,&local_3c), uVar5 != 0)) &&
              (uVar5 + local_3c == uVar4)) && ((2 < bVar13 || (local_3c == 0)))) {
            if ((flgs & 1) == 0) goto LAB_001ba33b;
            pParse_00 = (JsonParse *)0x0;
            iVar7 = jsonBlobMakeEditable(pParse,0);
            if (iVar7 == 0) goto LAB_001ba31e;
            goto LAB_001ba33b;
          }
          pParse->aBlob = (u8 *)0x0;
          pParse->nBlob = 0;
        }
      }
      pcVar11 = (char *)sqlite3ValueText(pArg,'\x01');
      pParse->zJson = pcVar11;
      iVar6 = sqlite3ValueBytes(pArg,'\x01');
      pParse->nJson = iVar6;
      if (db->mallocFailed != '\0') {
        pParse_00 = (JsonParse *)0x0;
        goto LAB_001ba31e;
      }
      if (iVar6 == 0) {
        if ((flgs & 2) == 0) {
          jsonParseFree(pParse);
          ctx->isError = 1;
          sqlite3VdbeMemSetStr
                    (ctx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
          ;
          goto LAB_001ba338;
        }
LAB_001ba2c5:
        pParse->nErr = '\x01';
        goto LAB_001ba33b;
      }
      iVar6 = jsonConvertTextToBlob(pParse,pCtx);
      if (iVar6 != 0) {
        if ((flgs & 2) != 0) goto LAB_001ba2c5;
        jsonParseFree(pParse);
        goto LAB_001ba338;
      }
      if (((pArg == (sqlite3_value *)0x0) ||
          ((pArg->flags >> 0xc & 1) == 0 || (pArg->flags & 0x12) == 0)) ||
         (pArg->xDel != sqlite3RCStrUnref)) {
        pcVar11 = sqlite3RCStrNew((long)pParse->nJson);
        if (pcVar11 != (char *)0x0) {
          memcpy(pcVar11,pParse->zJson,(long)pParse->nJson);
          pParse->zJson = pcVar11;
          pcVar11[pParse->nJson] = '\0';
          goto LAB_001ba1ee;
        }
LAB_001ba20a:
        pParse_00 = (JsonParse *)0x0;
        iVar6 = 3;
      }
      else {
        *(long *)(pParse->zJson + -8) = *(long *)(pParse->zJson + -8) + 1;
LAB_001ba1ee:
        pParse->bJsonIsRCStr = '\x01';
        iVar6 = jsonCacheInsert(ctx,pParse);
        if (iVar6 == 7) goto LAB_001ba20a;
        iVar6 = iVar7;
        if ((flgs & 1) == 0) {
          pParse_00 = (JsonParse *)0x0;
        }
        else {
          pJVar18 = (JsonParse *)0x0;
          pParse_00 = pParse;
        }
      }
    } while (iVar6 == 2);
    pParse = pJVar18;
    if (iVar6 != 3) goto LAB_001ba33b;
LAB_001ba31e:
    jsonParseFree(pParse_00);
    jsonParseFree(pParse);
    sqlite3_result_error_nomem(ctx);
  }
LAB_001ba338:
  pJVar18 = (JsonParse *)0x0;
LAB_001ba33b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pJVar18;
  }
  __stack_chk_fail();
}

Assistant:

static JsonParse *jsonParseFuncArg(
  sqlite3_context *ctx,
  sqlite3_value *pArg,
  u32 flgs
){
  int eType;                   /* Datatype of pArg */
  JsonParse *p = 0;            /* Value to be returned */
  JsonParse *pFromCache = 0;   /* Value taken from cache */
  sqlite3 *db;                 /* The database connection */

  assert( ctx!=0 );
  eType = sqlite3_value_type(pArg);
  if( eType==SQLITE_NULL ){
    return 0;
  }
  pFromCache = jsonCacheSearch(ctx, pArg);
  if( pFromCache ){
    pFromCache->nJPRef++;
    if( (flgs & JSON_EDITABLE)==0 ){
      return pFromCache;
    }
  }
  db = sqlite3_context_db_handle(ctx);
rebuild_from_cache:
  p = sqlite3DbMallocZero(db, sizeof(*p));
  if( p==0 ) goto json_pfa_oom;
  memset(p, 0, sizeof(*p));
  p->db = db;
  p->nJPRef = 1;
  if( pFromCache!=0 ){
    u32 nBlob = pFromCache->nBlob;
    p->aBlob = sqlite3DbMallocRaw(db, nBlob);
    if( p->aBlob==0 ) goto json_pfa_oom;
    memcpy(p->aBlob, pFromCache->aBlob, nBlob);
    p->nBlobAlloc = p->nBlob = nBlob;
    p->hasNonstd = pFromCache->hasNonstd;
    jsonParseFree(pFromCache);
    return p;
  }
  if( eType==SQLITE_BLOB ){
    if( jsonArgIsJsonb(pArg,p) ){
      if( (flgs & JSON_EDITABLE)!=0 && jsonBlobMakeEditable(p, 0)==0 ){
        goto json_pfa_oom;
      }
      return p;
    }
    /* If the blob is not valid JSONB, fall through into trying to cast
    ** the blob into text which is then interpreted as JSON.  (tag-20240123-a)
    **
    ** This goes against all historical documentation about how the SQLite
    ** JSON functions were suppose to work.  From the beginning, blob was
    ** reserved for expansion and a blob value should have raised an error.
    ** But it did not, due to a bug.  And many applications came to depend
    ** upon this buggy behavior, espeically when using the CLI and reading
    ** JSON text using readfile(), which returns a blob.  For this reason
    ** we will continue to support the bug moving forward.
    ** See for example https://sqlite.org/forum/forumpost/012136abd5292b8d
    */
  }
  p->zJson = (char*)sqlite3_value_text(pArg);
  p->nJson = sqlite3_value_bytes(pArg);
  if( db->mallocFailed ) goto json_pfa_oom;
  if( p->nJson==0 ) goto json_pfa_malformed;
  assert( p->zJson!=0 );
  if( jsonConvertTextToBlob(p, (flgs & JSON_KEEPERROR) ? 0 : ctx) ){
    if( flgs & JSON_KEEPERROR ){
      p->nErr = 1;
      return p;
    }else{
      jsonParseFree(p);
      return 0;
    }
  }else{
    int isRCStr = sqlite3ValueIsOfClass(pArg, sqlite3RCStrUnref);
    int rc;
    if( !isRCStr ){
      char *zNew = sqlite3RCStrNew( p->nJson );
      if( zNew==0 ) goto json_pfa_oom;
      memcpy(zNew, p->zJson, p->nJson);
      p->zJson = zNew;
      p->zJson[p->nJson] = 0;
    }else{
      sqlite3RCStrRef(p->zJson);
    }
    p->bJsonIsRCStr = 1;
    rc = jsonCacheInsert(ctx, p);
    if( rc==SQLITE_NOMEM ) goto json_pfa_oom;
    if( flgs & JSON_EDITABLE ){
      pFromCache = p;
      p = 0;
      goto rebuild_from_cache;
    }
  }
  return p;

json_pfa_malformed:
  if( flgs & JSON_KEEPERROR ){
    p->nErr = 1;
    return p;
  }else{
    jsonParseFree(p);
    sqlite3_result_error(ctx, "malformed JSON", -1);
    return 0;
  }

json_pfa_oom:
  jsonParseFree(pFromCache);
  jsonParseFree(p);
  sqlite3_result_error_nomem(ctx);
  return 0;
}